

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_tri_pliant_uv(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_uv)

{
  double dVar1;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 (*uv) [16];
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  REF_DBL *inv;
  REF_INT id;
  REF_INT nnode;
  REF_DBL total_force [3];
  REF_DBL n [3];
  REF_DBL dxyz [3];
  REF_DBL s [3];
  REF_DBL r [3];
  REF_DBL dxyz_duv [15];
  REF_DBL xyz_orig [3];
  REF_DBL duvn_dxyz [9];
  REF_DBL dxyz_duvn [9];
  REF_INT node_list [100];
  REF_INT local_3b8;
  int local_3b4;
  undefined1 (*local_3b0) [16];
  REF_DBL local_3a8 [4];
  REF_DBL local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  double adStack_368 [4];
  REF_DBL local_348 [4];
  REF_DBL local_328 [4];
  REF_DBL local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  REF_DBL local_288 [4];
  REF_DBL local_268 [10];
  REF_DBL local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  REF_DBL local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  REF_INT local_1c8 [102];
  
  ref_node = ref_grid->node;
  ref_geom = ref_grid->geom;
  uVar4 = ref_geom_unique_id(ref_geom,node,2,&local_3b8);
  if (uVar4 == 0) {
    uVar4 = ref_geom_tuv(ref_geom,node,2,local_3b8,ideal_uv);
    if (uVar4 == 0) {
      uVar4 = ref_cell_node_list_around(ref_grid->cell[3],node,100,&local_3b4,local_1c8);
      if (uVar4 == 0) {
        local_3a8[0] = 0.0;
        local_3a8[1] = 0.0;
        local_3a8[2] = 0.0;
        local_3b0 = (undefined1 (*) [16])ideal_uv;
        if (0 < local_3b4) {
          lVar6 = 0;
          do {
            uVar4 = ref_smooth_add_pliant_force(ref_node,node,local_1c8[lVar6],local_3a8);
            if (uVar4 != 0) {
              pcVar7 = "edge";
              uVar5 = 0x253;
              goto LAB_001f5859;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 < local_3b4);
        }
        uv = local_3b0;
        dVar1 = ref_grid->adapt->smooth_pliant_alpha;
        lVar6 = 0;
        do {
          adStack_368[lVar6] = local_3a8[lVar6] * dVar1;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        uVar4 = ref_egads_eval_at(ref_geom,2,local_3b8,(REF_DBL *)local_3b0,local_288,&local_308);
        if (uVar4 == 0) {
          uVar4 = ref_geom_face_rsn(ref_geom,local_3b8,(REF_DBL *)uv,local_328,local_348,&local_388)
          ;
          if (uVar4 == 0) {
            local_208 = local_2f8;
            local_218 = local_308;
            uStack_210 = uStack_300;
            local_200 = local_2f0;
            uStack_1f8 = uStack_2e8;
            local_1f0 = local_2e0;
            local_1e8 = local_388;
            uStack_1e0 = uStack_380;
            local_1d8 = local_378;
            inv = local_268;
            uVar4 = ref_matrix_inv_gen(3,&local_218,inv);
            if (uVar4 == 0) {
              dVar1 = *(double *)*uv;
              dVar3 = *(double *)(*uv + 8);
              lVar6 = 0;
              do {
                dVar1 = dVar1 + adStack_368[lVar6] * *inv;
                dVar3 = dVar3 + adStack_368[lVar6] * inv[1];
                lVar6 = lVar6 + 1;
                inv = inv + 3;
              } while (lVar6 != 3);
              auVar2._8_4_ = SUB84(dVar3,0);
              auVar2._0_8_ = dVar1;
              auVar2._12_4_ = (int)((ulong)dVar3 >> 0x20);
              *uv = auVar2;
              return 0;
            }
            pcVar7 = "inverse transformation";
            uVar5 = 0x266;
          }
          else {
            pcVar7 = "eval orthonormal face system";
            uVar5 = 0x25e;
          }
        }
        else {
          pcVar7 = "eval face derivatives";
          uVar5 = 0x25c;
        }
      }
      else {
        pcVar7 = "node list for edges";
        uVar5 = 0x24d;
      }
    }
    else {
      pcVar7 = "get uv_orig";
      uVar5 = 0x249;
    }
  }
  else {
    pcVar7 = "get id";
    uVar5 = 0x248;
  }
LAB_001f5859:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar5,
         "ref_smooth_tri_pliant_uv",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_pliant_uv(REF_GRID ref_grid,
                                                   REF_INT node,
                                                   REF_DBL *ideal_uv) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ixyz, id;
  REF_INT max_node = 100, nnode;
  REF_INT node_list[100];
  REF_INT edge;
  REF_DBL total_force[3], dxyz[3], xyz_orig[3], dxyz_duv[15];
  REF_DBL dxyz_duvn[9], duvn_dxyz[9], r[3], s[3], n[3];
  REF_BOOL self_check = REF_FALSE;

  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "get id");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, ideal_uv), "get uv_orig");

  RSS(ref_cell_node_list_around(ref_grid_tri(ref_grid), node, max_node, &nnode,
                                node_list),
      "node list for edges");

  for (ixyz = 0; ixyz < 3; ixyz++) total_force[ixyz] = 0.0;
  for (edge = 0; edge < nnode; edge++) {
    RSS(ref_smooth_add_pliant_force(ref_node, node, node_list[edge],
                                    total_force),
        "edge");
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    dxyz[ixyz] =
        ref_grid_adapt(ref_grid, smooth_pliant_alpha) * total_force[ixyz];

  RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id, ideal_uv, xyz_orig,
                        dxyz_duv),
      "eval face derivatives");
  RSS(ref_geom_face_rsn(ref_geom, id, ideal_uv, r, s, n),
      "eval orthonormal face system");

  for (ixyz = 0; ixyz < 3; ixyz++) {
    dxyz_duvn[ixyz + 0] = dxyz_duv[ixyz + 0];
    dxyz_duvn[ixyz + 3] = dxyz_duv[ixyz + 3];
    dxyz_duvn[ixyz + 6] = n[ixyz];
  }

  RSS(ref_matrix_inv_gen(3, dxyz_duvn, duvn_dxyz), "inverse transformation");

  for (ixyz = 0; ixyz < 3; ixyz++) {
    ideal_uv[0] += duvn_dxyz[0 + 3 * ixyz] * dxyz[ixyz];
    ideal_uv[1] += duvn_dxyz[1 + 3 * ixyz] * dxyz[ixyz];
  }

  if (self_check) {
    REF_DBL du, dv, dn, check_dxyz[3];
    du = 0;
    dv = 0;
    dn = 0;
    for (ixyz = 0; ixyz < 3; ixyz++) {
      du += duvn_dxyz[0 + 3 * ixyz] * dxyz[ixyz];
      dv += duvn_dxyz[1 + 3 * ixyz] * dxyz[ixyz];
      dn += duvn_dxyz[2 + 3 * ixyz] * dxyz[ixyz];
    }
    check_dxyz[0] = du * dxyz_duv[0] + dv * dxyz_duv[3] + dn * n[0];
    check_dxyz[1] = du * dxyz_duv[1] + dv * dxyz_duv[4] + dn * n[1];
    check_dxyz[2] = du * dxyz_duv[2] + dv * dxyz_duv[5] + dn * n[2];
    if (ABS(check_dxyz[0] - dxyz[0]) > 1.0e-12 ||
        ABS(check_dxyz[1] - dxyz[1]) > 1.0e-12 ||
        ABS(check_dxyz[2] - dxyz[2]) > 1.0e-12) {
      printf("du %f dv %f dn %f dxyz %f %f %f\n", du, dv, dn, dxyz[0], dxyz[1],
             dxyz[2]);
      printf(" err %e %e %e\n", check_dxyz[0] - dxyz[0],
             check_dxyz[1] - dxyz[1], check_dxyz[2] - dxyz[2]);
      ref_node_location(ref_node, node);
    }
  }

  return REF_SUCCESS;
}